

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoundTrip.cpp
# Opt level: O0

void __thiscall wasm::RoundTrip::~RoundTrip(RoundTrip *this)

{
  RoundTrip *this_local;
  
  ~RoundTrip(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

void run(Module* module) override {
    BufferWithRandomAccess buffer;
    // Save features, which would not otherwise make it through a round trip if
    // the target features section has been stripped. We also need them in order
    // to tell the builder which features to build with.
    auto features = module->features;
    // Write, clear, and read the module
    WasmBinaryWriter(module, buffer).write();
    ModuleUtils::clearModule(*module);
    auto input = buffer.getAsChars();
    WasmBinaryBuilder parser(*module, features, input);
    parser.setDWARF(getPassOptions().debugInfo);
    try {
      parser.read();
    } catch (ParseException& p) {
      p.dump(std::cerr);
      std::cerr << '\n';
      Fatal() << "error in parsing wasm binary";
    }
  }